

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Builder * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::getResultsBuilder
          (Builder *__return_storage_ptr__,RpcServerResponseImpl *this)

{
  PointerBuilder local_28;
  
  local_28.pointer = (this->payload)._builder.pointers;
  local_28.segment = (this->payload)._builder.segment;
  local_28.capTable = (this->payload)._builder.capTable;
  PointerBuilder::imbue
            (&__return_storage_ptr__->builder,&local_28,&(this->capTable).super_CapTableBuilder);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResultsBuilder() override {
      return capTable.imbue(payload.getContent());
    }